

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenRefIsNull(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  RefIsNull *pRVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pRVar1 = wasm::Builder::makeRefIsNull(&local_10,value);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefIsNull(BinaryenModuleRef module,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefIsNull((Expression*)value));
}